

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

Scene * __thiscall CMU462::DynamicScene::Scene::get_transformed_static_scene(Scene *this,double t)

{
  _Base_ptr p_Var1;
  Scene *this_00;
  SceneObject *staticObject;
  vector<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  staticLights;
  vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  staticObjects;
  
  staticObjects.
  super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  staticObjects.
  super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  staticObjects.
  super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  staticLights.
  super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  staticLights.
  super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  staticLights.
  super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    staticObject = (SceneObject *)(**(code **)(**(long **)(p_Var1 + 1) + 0x40))(SUB84(t,0));
    if (staticObject != (SceneObject *)0x0) {
      std::
      vector<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
      ::push_back(&staticObjects,&staticObject);
    }
  }
  for (p_Var1 = (this->lights)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->lights)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    staticObject = (SceneObject *)(**(code **)**(undefined8 **)(p_Var1 + 1))();
    std::vector<CMU462::StaticScene::SceneLight*,std::allocator<CMU462::StaticScene::SceneLight*>>::
    emplace_back<CMU462::StaticScene::SceneLight*>
              ((vector<CMU462::StaticScene::SceneLight*,std::allocator<CMU462::StaticScene::SceneLight*>>
                *)&staticLights,(SceneLight **)&staticObject);
  }
  this_00 = (Scene *)operator_new(0x30);
  StaticScene::Scene::Scene(this_00,&staticObjects,&staticLights);
  std::
  _Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
  ::~_Vector_base(&staticLights.
                   super__Vector_base<CMU462::StaticScene::SceneLight_*,_std::allocator<CMU462::StaticScene::SceneLight_*>_>
                 );
  std::
  _Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
  ::~_Vector_base(&staticObjects.
                   super__Vector_base<CMU462::StaticScene::SceneObject_*,_std::allocator<CMU462::StaticScene::SceneObject_*>_>
                 );
  return this_00;
}

Assistant:

StaticScene::Scene *Scene::get_transformed_static_scene(double t) {
  std::vector<StaticScene::SceneObject *> staticObjects;
  std::vector<StaticScene::SceneLight *> staticLights;

  for (SceneObject *obj : objects) {
    auto staticObject = obj->get_transformed_static_object(t);
    if (staticObject != nullptr) staticObjects.push_back(staticObject);
  }
  for (SceneLight *light : lights) {
    staticLights.push_back(light->get_static_light());
  }
  return new StaticScene::Scene(staticObjects, staticLights);
}